

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O3

void Omega_h::gmsh::anon_unknown_0::read_internal(istream *stream,Mesh *mesh)

{
  int *piVar1;
  ClassSets *pCVar2;
  byte *pbVar3;
  byte bVar4;
  _Rb_tree_color _Var5;
  pair<int,_int> pVar6;
  iterator iVar7;
  pointer piVar8;
  void *pvVar9;
  Alloc *pAVar10;
  pointer pVVar11;
  pointer pVVar12;
  undefined4 uVar13;
  _Base_ptr p_Var14;
  uint uVar15;
  bool bVar16;
  char cVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  istream *this;
  istream *piVar22;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *pvVar23;
  undefined8 uVar24;
  _Base_ptr p_Var25;
  ulong uVar26;
  uint *puVar27;
  undefined7 uVar29;
  undefined1 *puVar28;
  LOs *ev2v;
  Read<signed_char> *this_00;
  undefined8 *puVar30;
  _Base_ptr p_Var31;
  ulong uVar32;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer __buf;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  byte *pbVar33;
  byte *pbVar34;
  char *pcVar35;
  HostWrite<int> *pHVar36;
  _Base_ptr p_Var37;
  ulong uVar38;
  Int j;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  pointer ppVar42;
  long lVar43;
  int iVar44;
  uint __len;
  byte *pbVar45;
  LO size_in;
  ulong uVar46;
  vector<int,std::allocator<int>> *this_01;
  bool bVar47;
  initializer_list<std::pair<int,_int>_> __l;
  int node_number;
  Int physical_1;
  int nnodes;
  I32 physical_2;
  Int physical;
  I32 elementary;
  Int num_volumes;
  vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> node_coords;
  HostWrite<double> host_coords;
  Real format;
  I32 ignored;
  int one;
  Int data_size;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_nodes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  physical_names;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_class_ids;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> node_number_map;
  Int file_type;
  uint local_354;
  ClassSets *local_350;
  uint local_348;
  Omega_h_Family local_344;
  int local_340;
  int local_33c;
  pointer local_338;
  HostWrite<int> local_330;
  int local_31c;
  HostWrite<int> local_318;
  vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> local_308;
  undefined1 local_2e8 [32];
  double local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [2];
  undefined8 auStack_280 [22];
  char *local_1d0;
  _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1c8;
  undefined8 uStack_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  long lStack_1a0;
  long local_198;
  undefined8 uStack_190;
  long local_188;
  long lStack_180;
  undefined8 local_178;
  long lStack_170;
  long local_168;
  undefined8 uStack_160;
  LOs local_158;
  LOs local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  long lStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_b8;
  uint local_84;
  Write<int> local_80;
  Read<signed_char> local_70;
  Write<double> local_60;
  Read<signed_char> local_50;
  Write<int> local_40;
  
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_2c0._8_8_ = mesh;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$MeshFormat","");
  seek_line(stream,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  this = std::istream::_M_extract<double>((double *)stream);
  piVar22 = (istream *)std::istream::operator>>((istream *)this,(int *)&local_84);
  std::istream::operator>>(piVar22,(int *)((long)&uStack_1c0 + 4));
  if (1 < local_84) {
    pcVar35 = "file_type == 0 || file_type == 1";
    uVar24 = 0xdd;
LAB_002d3846:
    fail("assertion %s failed at %s +%d\n",pcVar35,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,uVar24);
  }
  local_350 = (ClassSets *)CONCAT44(local_350._4_4_,local_84);
  if (local_84 == 1) {
    eat_newlines(stream);
    binary::read_value<int>(stream,(int *)local_2b0,false);
    bVar47 = local_2b0._0_4_ != 1;
    if (bVar47) {
      binary::swap_bytes<int>((int *)local_2b0);
      if (local_2b0._0_4_ != 1) {
        pcVar35 = "one == 1";
        uVar24 = 0xe7;
        goto LAB_002d3846;
      }
    }
  }
  else {
    bVar47 = false;
  }
  if (uStack_1c0._4_4_ != 8) {
    pcVar35 = "data_size == sizeof(Real)";
    uVar24 = 0xea;
    goto LAB_002d3846;
  }
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$PhysicalNames","");
  bVar16 = seek_optional_section(stream,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  iVar18 = (int)local_350;
  if (bVar16) {
    if ((int)local_350 == 1) {
      binary::read_value<int>(stream,(int *)&local_1b8,bVar47);
    }
    else {
      std::istream::operator>>((istream *)stream,(int *)&local_1b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_138,
              (long)(int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    eat_newlines(stream);
    if (0 < (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      iVar19 = 0;
      do {
        if (iVar18 == 1) {
          binary::read_value<int>(stream,(int *)&local_b8,bVar47);
          binary::read_value<int>(stream,(int *)local_2e8,bVar47);
        }
        else {
          std::istream::operator>>((istream *)stream,(int *)&local_b8);
          std::istream::operator>>((istream *)stream,(int *)local_2e8);
        }
        uVar13 = local_2e8._0_4_;
        if (local_2e8._0_4_ != iVar19 + 1) {
          fail("assertion %s failed at %s +%d\n","number == i + 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0xf5);
        }
        local_2b0._0_8_ = local_2b0 + 0x10;
        local_2b0._8_8_ = (pointer)0x0;
        local_2a0[0]._M_local_buf[0] = '\0';
        std::operator>>(stream,(string *)local_2b0);
        std::__cxx11::string::substr((ulong)&local_118,(ulong)local_2b0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                   &local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                   local_2a0[0]._M_local_buf[0]) + 1);
        }
        iVar18 = (int)local_350;
        iVar19 = uVar13;
      } while ((int)uVar13 <
               (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$Entities","");
  bVar16 = seek_optional_section(stream,(string *)local_2b0);
  if ((vector<int,std::allocator<int>> *)local_2b0._0_8_ !=
      (vector<int,std::allocator<int>> *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  if (bVar16) {
    local_338 = (pointer)local_2c8;
    if (iVar18 == 1) {
      binary::read_value<int>(stream,(int *)&local_b8,bVar47);
      binary::read_value<int>(stream,(int *)local_2e8,bVar47);
      binary::read_value<int>(stream,(int *)&local_308,bVar47);
      binary::read_value<int>(stream,(int *)&local_318,bVar47);
    }
    else {
      std::istream::operator>>((istream *)stream,(int *)&local_b8);
      std::istream::operator>>((istream *)stream,(int *)local_2e8);
      std::istream::operator>>((istream *)stream,(int *)&local_308);
      std::istream::operator>>((istream *)stream,(int *)&local_318);
    }
    iVar19 = local_b8._M_impl._0_4_ + -1;
    bVar16 = 0 < (int)local_b8._M_impl._0_4_;
    local_b8._M_impl._0_4_ = iVar19;
    if (bVar16) {
      pCVar2 = (ClassSets *)(local_2c0._8_8_ + 0x3a8);
      do {
        if (iVar18 == 1) {
          binary::read_value<int>(stream,(int *)&local_118,bVar47);
          binary::read_value<double>(stream,(double *)local_2b0,bVar47);
          binary::read_value<double>(stream,(double *)(local_2b0 + 8),bVar47);
          binary::read_value<double>(stream,(double *)(local_2b0 + 0x10),bVar47);
          if (((double)local_338 == 4.0) && (!NAN((double)local_338))) {
            binary::read_value<double>(stream,(double *)local_2b0,bVar47);
            binary::read_value<double>(stream,(double *)(local_2b0 + 8),bVar47);
            binary::read_value<double>(stream,(double *)(local_2b0 + 0x10),bVar47);
          }
          binary::read_value<int>(stream,(int *)&local_1b8,bVar47);
        }
        else {
          std::istream::operator>>((istream *)stream,(int *)&local_118);
          std::istream::_M_extract<double>((double *)stream);
          std::istream::_M_extract<double>((double *)stream);
          std::istream::_M_extract<double>((double *)stream);
          if (((double)local_338 == 4.0) && (!NAN((double)local_338))) {
            std::istream::_M_extract<double>((double *)stream);
            std::istream::_M_extract<double>((double *)stream);
            std::istream::_M_extract<double>((double *)stream);
          }
          std::istream::operator>>((istream *)stream,(int *)&local_1b8);
        }
        while( true ) {
          iVar19 = (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + -1);
          if (iVar19 < 1) break;
          if (iVar18 == 1) {
            binary::read_value<int>(stream,(int *)&local_330,bVar47);
          }
          else {
            std::istream::operator>>((istream *)stream,(int *)&local_330);
          }
          if ((ulong)(uint)local_330.write_.shared_alloc_.alloc == 0) {
            fail("assertion %s failed at %s +%d\n","physical != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0xac);
          }
          if (0 < (int)(uint)local_330.write_.shared_alloc_.alloc) {
            pvVar23 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                      ::operator[](pCVar2,local_138.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                          ((ulong)(uint)local_330.write_.shared_alloc_.alloc - 1));
            local_340 = 0;
            std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
            emplace_back<int,int&>(pvVar23,&local_340,(int *)&local_118);
          }
        }
        iVar19 = local_b8._M_impl._0_4_ + -1;
        bVar16 = 0 < (int)local_b8._M_impl._0_4_;
        local_b8._M_impl._0_4_ = iVar19;
      } while (bVar16);
    }
    local_118._M_dataplus._M_p._4_4_ = 2;
    local_118._M_dataplus._M_p._0_4_ = (int)local_2e8._0_8_;
    local_118._M_string_length =
         CONCAT44(2,local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_4_);
    local_118.field_2._M_allocated_capacity._4_4_ = 3;
    local_118.field_2._M_allocated_capacity._0_4_ = (uint)local_318.write_.shared_alloc_.alloc;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_118;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_2b0,__l,
               (allocator_type *)&local_1b8);
    local_338 = (pointer)local_2b0._8_8_;
    if (local_2b0._0_8_ != local_2b0._8_8_) {
      pCVar2 = (ClassSets *)(local_2c0._8_8_ + 0x3a8);
      ppVar42 = (pointer)local_2b0._0_8_;
      do {
        local_330.write_.shared_alloc_.alloc._0_4_ = ppVar42->second;
        iVar18 = ppVar42->first;
        if (0 < ppVar42->first) {
          do {
            if ((int)local_350 == 1) {
              binary::read_value<int>(stream,&local_340,bVar47);
              binary::read_value<double>(stream,(double *)&local_118,bVar47);
              binary::read_value<double>(stream,(double *)&local_118._M_string_length,bVar47);
              binary::read_value<double>
                        (stream,(double *)&local_118.field_2._M_allocated_capacity,bVar47);
              binary::read_value<double>(stream,(double *)&local_1b8,bVar47);
              binary::read_value<double>
                        (stream,(double *)
                                &local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,bVar47);
              binary::read_value<double>
                        (stream,(double *)
                                &local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,bVar47);
              binary::read_value<int>(stream,(int *)&local_354,bVar47);
            }
            else {
              std::istream::operator>>((istream *)stream,&local_340);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::operator>>((istream *)stream,(int *)&local_354);
            }
            while( true ) {
              uVar20 = local_354 - 1;
              if ((int)local_354 < 1) break;
              if ((int)local_350 == 1) {
                local_354 = uVar20;
                binary::read_value<int>(stream,(int *)&local_348,bVar47);
              }
              else {
                local_354 = uVar20;
                std::istream::operator>>((istream *)stream,(int *)&local_348);
              }
              if ((ulong)local_348 == 0) {
                fail("assertion %s failed at %s +%d\n","physical != 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                     ,199);
              }
              if (0 < (int)local_348) {
                pvVar23 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                          ::operator[](pCVar2,local_138.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                              ((ulong)local_348 - 1));
                std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
                emplace_back<int_const&,int&>(pvVar23,(int *)&local_330,&local_340);
              }
            }
            if ((int)local_350 == 1) {
              local_354 = uVar20;
              binary::read_value<int>(stream,(int *)&local_348,bVar47);
            }
            else {
              local_354 = uVar20;
              std::istream::operator>>((istream *)stream,(int *)&local_348);
            }
            while (uVar20 = local_348 - 1, 0 < (int)local_348) {
              if ((int)local_350 == 1) {
                local_348 = uVar20;
                binary::read_value<int>(stream,&local_33c,bVar47);
              }
              else {
                local_348 = uVar20;
                std::istream::operator>>((istream *)stream,&local_33c);
              }
            }
            bVar16 = 1 < iVar18;
            iVar18 = iVar18 + -1;
            local_348 = uVar20;
          } while (bVar16);
        }
        ppVar42 = ppVar42 + 1;
      } while (ppVar42 != local_338);
      iVar18 = (int)local_350;
    }
    if ((vector<int,std::allocator<int>> *)local_2b0._0_8_ != (vector<int,std::allocator<int>> *)0x0
       ) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) - local_2b0._0_8_);
    }
    local_2b0._0_8_ = local_2b0 + 0x10;
    local_2b0._8_8_ = (pointer)0x0;
    local_2a0[0]._M_local_buf[0] = '\0';
    cVar17 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (stream,(string *)local_2b0,cVar17);
    pbVar45 = (byte *)local_2b0._0_8_;
    if ((pointer)local_2b0._8_8_ != (pointer)0x0) {
      pbVar3 = (byte *)(local_2b0._0_8_ + local_2b0._8_8_);
      pbVar34 = (byte *)local_2b0._0_8_;
      if (0 < (long)local_2b0._8_8_ >> 2) {
        pbVar34 = (byte *)(local_2b0._0_8_ + (local_2b0._8_8_ & 0xfffffffffffffffc));
        lVar43 = ((long)local_2b0._8_8_ >> 2) + 1;
        pbVar33 = (byte *)(local_2b0._0_8_ + 3);
        do {
          iVar18 = isspace((uint)pbVar33[-3]);
          if (iVar18 != 0) {
            pbVar33 = pbVar33 + -3;
            goto LAB_002d1dc1;
          }
          iVar18 = isspace((uint)pbVar33[-2]);
          if (iVar18 != 0) {
            pbVar33 = pbVar33 + -2;
            goto LAB_002d1dc1;
          }
          iVar18 = isspace((uint)pbVar33[-1]);
          if (iVar18 != 0) {
            pbVar33 = pbVar33 + -1;
            goto LAB_002d1dc1;
          }
          iVar18 = isspace((uint)*pbVar33);
          if (iVar18 != 0) goto LAB_002d1dc1;
          lVar43 = lVar43 + -1;
          pbVar33 = pbVar33 + 4;
        } while (1 < lVar43);
      }
      lVar43 = (long)pbVar3 - (long)pbVar34;
      if (lVar43 == 1) {
LAB_002d1d9e:
        iVar18 = isspace((uint)*pbVar34);
        pbVar33 = pbVar34;
        if (iVar18 == 0) {
          pbVar33 = pbVar3;
        }
LAB_002d1dc1:
        pbVar34 = pbVar33 + 1;
        if (pbVar34 != pbVar3 && pbVar33 != pbVar3) {
          do {
            bVar4 = *pbVar34;
            iVar18 = isspace((uint)bVar4);
            if (iVar18 == 0) {
              *pbVar33 = bVar4;
              pbVar33 = pbVar33 + 1;
            }
            pbVar34 = pbVar34 + 1;
            pbVar45 = (byte *)local_2b0._0_8_;
          } while (pbVar34 != pbVar3);
        }
      }
      else {
        if (lVar43 == 2) {
LAB_002d1d8e:
          iVar18 = isspace((uint)*pbVar34);
          pbVar33 = pbVar34;
          if (iVar18 == 0) {
            pbVar34 = pbVar34 + 1;
            goto LAB_002d1d9e;
          }
          goto LAB_002d1dc1;
        }
        pbVar33 = pbVar3;
        if (lVar43 == 3) {
          iVar18 = isspace((uint)*pbVar34);
          pbVar33 = pbVar34;
          if (iVar18 == 0) {
            pbVar34 = pbVar34 + 1;
            goto LAB_002d1d8e;
          }
          goto LAB_002d1dc1;
        }
      }
      iVar18 = (int)local_350;
      std::__cxx11::string::_M_erase((ulong)local_2b0,(long)pbVar33 - (long)pbVar45);
      if ((pointer)local_2b0._8_8_ != (pointer)0x0) {
        uVar24 = 0x105;
        pcVar35 = "line.empty()";
        goto LAB_002d38eb;
      }
    }
    cVar17 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (stream,(string *)local_2b0,cVar17);
    iVar19 = std::__cxx11::string::compare(local_2b0);
    if (iVar19 != 0) {
      uVar24 = 0x107;
      pcVar35 = "line == \"$EndEntities\"";
LAB_002d38eb:
      fail("assertion %s failed at %s +%d\n",pcVar35,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,uVar24);
    }
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$Nodes","");
  seek_line(stream,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Vector<3> *)0x0;
  local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (Vector<3> *)0x0;
  p_Var25 = &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var25;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right = p_Var25;
  if (4.0 <= local_2c8) {
    eat_newlines(stream);
    if (iVar18 == 1) {
      binary::read_value<int>(stream,(int *)&local_118,bVar47);
      binary::read_value<int>(stream,&local_340,bVar47);
    }
    else {
      std::istream::operator>>((istream *)stream,(int *)&local_118);
      std::istream::operator>>((istream *)stream,&local_340);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
              (&local_308,(long)local_340);
    if (4.1 <= local_2c8) {
      if (iVar18 == 1) {
        binary::read_value<int>(stream,(int *)&local_1b8,bVar47);
        binary::read_value<int>(stream,(int *)&local_1b8,bVar47);
      }
      else {
        std::istream::operator>>((istream *)stream,(int *)&local_1b8);
        std::istream::operator>>((istream *)stream,(int *)&local_1b8);
      }
      if (0 < (int)local_118._M_dataplus._M_p) {
        local_338 = (pointer)((ulong)local_338 & 0xffffffff00000000);
        do {
          if (iVar18 == 1) {
            binary::read_value<int>(stream,(int *)&local_318,bVar47);
            binary::read_value<int>(stream,(int *)local_2e8,bVar47);
            binary::read_value<int>(stream,(int *)&local_330,bVar47);
            binary::read_value<int>(stream,(int *)&local_354,bVar47);
          }
          else {
            std::istream::operator>>((istream *)stream,(int *)&local_318);
            std::istream::operator>>((istream *)stream,(int *)local_2e8);
            std::istream::operator>>((istream *)stream,(int *)&local_330);
            std::istream::operator>>((istream *)stream,(int *)&local_354);
          }
          if (0 < (int)local_354) {
            iVar18 = 0;
            do {
              if ((int)local_350 == 1) {
                binary::read_value<int>(stream,(int *)local_2b0,bVar47);
              }
              else {
                std::istream::operator>>((istream *)stream,(int *)local_2b0);
              }
              pVVar12 = local_308.
                        super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pVVar11 = local_308.
                        super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar27 = (uint *)std::
                                map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                              *)&local_b8,(key_type *)local_2b0);
              uVar20 = (int)((ulong)((long)pVVar12 - (long)pVVar11) >> 3) * -0x55555555 + iVar18;
              p_Var25 = (_Base_ptr)(ulong)uVar20;
              *puVar27 = uVar20;
              iVar18 = iVar18 + 1;
            } while (iVar18 < (int)local_354);
            if (0 < (int)local_354) {
              iVar18 = 0;
              do {
                if ((int)local_350 == 1) {
                  binary::read_value<double>(stream,(double *)local_2b0,bVar47);
                  binary::read_value<double>(stream,(double *)(local_2b0 + 8),bVar47);
                  binary::read_value<double>(stream,(double *)(local_2b0 + 0x10),bVar47);
                }
                else {
                  std::istream::_M_extract<double>((double *)stream);
                  std::istream::_M_extract<double>((double *)stream);
                  std::istream::_M_extract<double>((double *)stream);
                }
                if (local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>::
                  _M_realloc_insert<Omega_h::Vector<3>const&>
                            ((vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>> *)
                             &local_308,
                             (iterator)
                             local_308.
                             super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Vector<3> *)local_2b0);
                }
                else {
                  ((local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[2] =
                       (double)CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                        local_2a0[0]._M_local_buf[0]);
                  ((local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[0] =
                       (double)local_2b0._0_8_;
                  ((local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[1] =
                       (double)local_2b0._8_8_;
                  local_308.
                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_308.
                       super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                iVar18 = iVar18 + 1;
              } while (iVar18 < (int)local_354);
            }
          }
          iVar19 = (int)local_338 + 1;
          local_338 = (pointer)CONCAT44(local_338._4_4_,iVar19);
          iVar18 = (int)local_350;
        } while (iVar19 < (int)local_118._M_dataplus._M_p);
      }
    }
    else if (0 < (int)local_118._M_dataplus._M_p) {
      local_338 = (pointer)((ulong)local_338 & 0xffffffff00000000);
      do {
        if (iVar18 == 1) {
          binary::read_value<int>(stream,(int *)&local_1b8,bVar47);
          binary::read_value<int>(stream,(int *)local_2e8,bVar47);
          binary::read_value<int>(stream,(int *)&local_318,bVar47);
          binary::read_value<int>(stream,(int *)&local_330,bVar47);
        }
        else {
          std::istream::operator>>((istream *)stream,(int *)&local_1b8);
          std::istream::operator>>((istream *)stream,(int *)local_2e8);
          std::istream::operator>>((istream *)stream,(int *)&local_318);
          std::istream::operator>>((istream *)stream,(int *)&local_330);
        }
        if (0 < (int)(uint)local_330.write_.shared_alloc_.alloc) {
          iVar18 = 0;
          do {
            if ((int)local_350 == 1) {
              binary::read_value<int>(stream,(int *)&local_354,bVar47);
            }
            else {
              std::istream::operator>>((istream *)stream,(int *)&local_354);
            }
            pVVar12 = local_308.
                      super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pVVar11 = local_308.
                      super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar27 = (uint *)std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_b8,(key_type *)&local_354);
            uVar20 = (int)((ulong)((long)pVVar12 - (long)pVVar11) >> 3) * -0x55555555;
            p_Var25 = (_Base_ptr)(ulong)uVar20;
            *puVar27 = uVar20;
            if ((int)local_350 == 1) {
              binary::read_value<double>(stream,(double *)local_2b0,bVar47);
              binary::read_value<double>(stream,(double *)(local_2b0 + 8),bVar47);
              binary::read_value<double>(stream,(double *)(local_2b0 + 0x10),bVar47);
            }
            else {
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
              std::istream::_M_extract<double>((double *)stream);
            }
            if (local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>::
              _M_realloc_insert<Omega_h::Vector<3>const&>
                        ((vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>> *)&local_308
                         ,(iterator)
                          local_308.
                          super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(Vector<3> *)local_2b0);
            }
            else {
              ((local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[2] =
                   (double)CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                    local_2a0[0]._M_local_buf[0]);
              ((local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[0] =
                   (double)local_2b0._0_8_;
              ((local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[1] =
                   (double)local_2b0._8_8_;
              local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_308.
                   super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar18 = iVar18 + 1;
          } while (iVar18 < (int)(uint)local_330.write_.shared_alloc_.alloc);
        }
        iVar19 = (int)local_338 + 1;
        local_338 = (pointer)CONCAT44(local_338._4_4_,iVar19);
        iVar18 = (int)local_350;
      } while (iVar19 < (int)local_118._M_dataplus._M_p);
    }
  }
  else {
    std::istream::operator>>((istream *)stream,&local_340);
    if ((long)local_340 < 0) {
      fail("assertion %s failed at %s +%d\n","nnodes >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,0x145);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
              (&local_308,(long)local_340);
    eat_newlines(stream);
    if (0 < local_340) {
      iVar18 = 0;
      do {
        if ((int)local_350 == 1) {
          binary::read_value<int>(stream,(int *)&local_118,bVar47);
          iVar19 = iVar18 + 1;
          if ((int)local_118._M_dataplus._M_p != iVar19) {
LAB_002d3756:
            fail("assertion %s failed at %s +%d\n","number == i + 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0x14e);
          }
          binary::read_value<double>(stream,(double *)local_2b0,bVar47);
          binary::read_value<double>(stream,(double *)(local_2b0 + 8),bVar47);
          binary::read_value<double>(stream,(double *)(local_2b0 + 0x10),bVar47);
        }
        else {
          std::istream::operator>>((istream *)stream,(int *)&local_118);
          iVar19 = (int)local_118._M_dataplus._M_p;
          if ((int)local_118._M_dataplus._M_p != iVar18 + 1) goto LAB_002d3756;
          std::istream::_M_extract<double>((double *)stream);
          std::istream::_M_extract<double>((double *)stream);
          std::istream::_M_extract<double>((double *)stream);
        }
        if (local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>::
          _M_realloc_insert<Omega_h::Vector<3>const&>
                    ((vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>> *)&local_308,
                     (iterator)
                     local_308.
                     super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Vector<3> *)local_2b0);
        }
        else {
          ((local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[2] =
               (double)CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                local_2a0[0]._M_local_buf[0]);
          ((local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[0] =
               (double)local_2b0._0_8_;
          ((local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[1] =
               (double)local_2b0._8_8_;
          local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_308.
               super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar18 = iVar19;
      } while (iVar19 < local_340);
    }
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$Elements","");
  seek_line(stream,(string *)local_2b0);
  iVar18 = (int)local_350;
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_118.field_2._M_allocated_capacity = 0;
  local_118.field_2._8_8_ = 0;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_118._M_string_length = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  lStack_170 = 0;
  local_188 = 0;
  lStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lStack_1a0 = 0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (4.0 <= local_2c8) {
    eat_newlines(stream);
    if (iVar18 == 1) {
      binary::read_value<int>(stream,(int *)local_2b0,bVar47);
      binary::read_value<int>(stream,(int *)local_2e8,bVar47);
      if (4.1 <= local_2c8) {
        binary::read_value<int>(stream,(int *)&local_318,bVar47);
        binary::read_value<int>(stream,(int *)&local_318,bVar47);
      }
    }
    else {
      std::istream::operator>>((istream *)stream,(int *)local_2b0);
      std::istream::operator>>((istream *)stream,(int *)local_2e8);
      if (4.1 <= local_2c8) {
        std::istream::operator>>((istream *)stream,(int *)&local_318);
        std::istream::operator>>((istream *)stream,(int *)&local_318);
      }
    }
    if ((int)local_2b0._0_4_ < 1) {
      local_344 = OMEGA_H_SIMPLEX;
    }
    else {
      local_344 = OMEGA_H_SIMPLEX;
      local_1d0 = "dim == class_dim";
      iVar19 = 0;
      do {
        if ((local_2c8 != 4.0) || (NAN(local_2c8))) {
          if (iVar18 != 1) {
            std::istream::operator>>((istream *)stream,(int *)&local_330);
            pHVar36 = &local_318;
            goto LAB_002d2a02;
          }
          binary::read_value<int>(stream,(int *)&local_330,bVar47);
          pHVar36 = &local_318;
LAB_002d29ac:
          binary::read_value<int>(stream,(int *)pHVar36,bVar47);
          binary::read_value<int>(stream,(int *)&local_354,bVar47);
          binary::read_value<int>(stream,(int *)&local_348,bVar47);
        }
        else {
          if (iVar18 == 1) {
            binary::read_value<int>(stream,(int *)&local_318,bVar47);
            pHVar36 = &local_330;
            goto LAB_002d29ac;
          }
          std::istream::operator>>((istream *)stream,(int *)&local_318);
          pHVar36 = &local_330;
LAB_002d2a02:
          std::istream::operator>>((istream *)stream,(int *)pHVar36);
          std::istream::operator>>((istream *)stream,(int *)&local_354);
          std::istream::operator>>((istream *)stream,(int *)&local_348);
        }
        uVar20 = type_dim(local_354);
        if (uVar20 != (uint)local_330.write_.shared_alloc_.alloc) {
          uVar24 = 0x172;
          goto LAB_002d377c;
        }
        uVar24 = 0x40;
        if (0xf < local_354) {
LAB_002d37fc:
          local_1d0 = "false";
LAB_002d377c:
          fail("assertion %s failed at %s +%d\n",local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,uVar24);
        }
        uVar26 = (ulong)uVar20;
        local_1c8 = (_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     *)CONCAT44(local_1c8._4_4_,iVar19);
        if ((0x8016U >> (local_354 & 0x1f) & 1) == 0) {
          local_344 = OMEGA_H_HYPERCUBE;
          if ((0x28U >> (local_354 & 0x1f) & 1) != 0) goto LAB_002d2a87;
          goto LAB_002d37fc;
        }
        if (local_344 != OMEGA_H_SIMPLEX) {
LAB_002d2a87:
          (*(code *)(&DAT_00448c10 + *(int *)(&DAT_00448c10 + uVar26 * 4)))();
          return;
        }
        local_344 = OMEGA_H_SIMPLEX;
        ppVar42 = (pointer)(&local_118._M_dataplus + uVar26 * 3);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)ppVar42,
                   (long)(int)local_348 +
                   ((long)((&local_118._M_string_length)[uVar26 * 3] - (long)*ppVar42) >> 2));
        this_01 = (vector<int,std::allocator<int>> *)(&local_1b8 + uVar26);
        p_Var25 = (_Base_ptr)(long)(int)local_348;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)this_01,
                   (ulong)(uVar20 + 1) * (long)p_Var25 +
                   ((long)(&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_finish - *(long *)this_01 >> 2));
        if (0 < (int)local_348) {
          iVar18 = 0;
          local_338 = ppVar42;
          do {
            pVar6 = local_338[1];
            if (pVar6 == local_338[2]) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_338,(iterator)pVar6,
                         (int *)&local_318);
            }
            else {
              *(uint *)pVar6 = (uint)local_318.write_.shared_alloc_.alloc;
              local_338[1] = (pair<int,_int>)((long)pVar6 + 4);
            }
            if ((int)local_350 == 1) {
              binary::read_value<int>(stream,&local_33c,bVar47);
            }
            else {
              std::istream::operator>>((istream *)stream,&local_33c);
            }
            uVar41 = 0;
            do {
              if ((int)local_350 == 1) {
                binary::read_value<int>(stream,&local_31c,bVar47);
              }
              else {
                std::istream::operator>>((istream *)stream,&local_31c);
              }
              if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002d36d2:
                fail("assertion %s failed at %s +%d\n","it != node_number_map.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                     ,0x183);
              }
              p_Var31 = &local_b8._M_impl.super__Rb_tree_header._M_header;
              p_Var14 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var37 = p_Var14;
                p_Var25 = p_Var31;
                _Var5 = p_Var37[1]._M_color;
                p_Var31 = p_Var37;
                if ((int)_Var5 < local_31c) {
                  p_Var31 = p_Var25;
                }
                p_Var14 = (&p_Var37->_M_left)[(int)_Var5 < local_31c];
              } while ((&p_Var37->_M_left)[(int)_Var5 < local_31c] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var31 == &local_b8._M_impl.super__Rb_tree_header)
              goto LAB_002d36d2;
              if ((int)_Var5 < local_31c) {
                p_Var37 = p_Var25;
              }
              if (local_31c < (int)p_Var37[1]._M_color) goto LAB_002d36d2;
              iVar7._M_current =
                   (&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_01,iVar7,(int *)&p_Var31[1].field_0x4);
              }
              else {
                *iVar7._M_current = *(int *)&p_Var31[1].field_0x4;
                (&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar7._M_current + 1;
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar20 + 1);
            iVar18 = iVar18 + 1;
          } while (iVar18 < (int)local_348);
        }
        iVar19 = (int)local_1c8 + 1;
        iVar18 = (int)local_350;
      } while (iVar19 < (int)local_2b0._0_4_);
    }
    goto LAB_002d2fa9;
  }
  std::istream::operator>>((istream *)stream,(int *)&local_318);
  if ((int)(uint)local_318.write_.shared_alloc_.alloc < 0) {
    fail("assertion %s failed at %s +%d\n","nents >= 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x18c);
  }
  lVar43 = 0xe0;
  puVar30 = auStack_280;
  do {
    puVar30[-6] = puVar30;
    puVar30[-5] = 1;
    puVar30[-4] = 0;
    puVar30[-3] = 0;
    *(undefined4 *)(puVar30 + -2) = 0x3f800000;
    puVar30[-1] = 0;
    *puVar30 = 0;
    puVar30 = puVar30 + 7;
    lVar43 = lVar43 + -0x38;
  } while (lVar43 != 0);
  if (iVar18 == 1) {
    eat_newlines(stream);
    if ((int)(uint)local_318.write_.shared_alloc_.alloc < 1) {
LAB_002d2df5:
      local_344 = OMEGA_H_SIMPLEX;
    }
    else {
      local_344 = OMEGA_H_SIMPLEX;
      iVar18 = 0;
      do {
        binary::read_value<int>(stream,(int *)local_2e8,bVar47);
        binary::read_value<int>(stream,(int *)&local_330,bVar47);
        binary::read_value<int>(stream,(int *)&local_354,bVar47);
        uVar20 = type_dim(local_2e8._0_4_);
        if (0xf < (uint)local_2e8._0_4_) {
LAB_002d386e:
          fail("assertion %s failed at %s +%d\n","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x40);
        }
        if ((0x8016U >> (local_2e8._0_4_ & 0x1f) & 1) == 0) {
          local_344 = OMEGA_H_HYPERCUBE;
          if ((0x28U >> (local_2e8._0_4_ & 0x1f) & 1) == 0) goto LAB_002d386e;
LAB_002d26e7:
          (*(code *)(&DAT_00448c20 + *(int *)(&DAT_00448c20 + (ulong)uVar20 * 4)))();
          return;
        }
        if (local_344 != OMEGA_H_SIMPLEX) goto LAB_002d26e7;
        local_350 = (ClassSets *)CONCAT44(local_350._4_4_,uVar20 + 1);
        local_344 = OMEGA_H_SIMPLEX;
        if ((int)local_354 < 2) {
          fail("assertion %s failed at %s +%d\n","ntags >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x19b);
        }
        if (0 < (int)(uint)local_330.write_.shared_alloc_.alloc) {
          lVar43 = (ulong)(uVar20 << 3) * 3;
          local_338 = (pointer)((long)&local_118._M_dataplus._M_p + lVar43);
          local_1c8 = (_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)(local_2b0 + (ulong)uVar20 * 0x38);
          iVar19 = 0;
          do {
            binary::read_value<int>(stream,(int *)&local_348,bVar47);
            binary::read_value<int>(stream,&local_33c,bVar47);
            binary::read_value<int>(stream,&local_31c,bVar47);
            pVar6 = local_338[1];
            if (pVar6 == local_338[2]) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_338,(iterator)pVar6,&local_31c);
            }
            else {
              *(int *)pVar6 = local_31c;
              local_338[1] = (pair<int,_int>)((long)pVar6 + 4);
            }
            if (local_33c != 0) {
              std::
              _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<int&,int&>(local_1c8,&local_31c,&local_33c);
            }
            iVar44 = (int)local_350;
            if (2 < (int)local_354) {
              iVar44 = 2;
              do {
                binary::read_value<int>(stream,(int *)(local_2c0._M_local_buf + 4),false);
                iVar44 = iVar44 + 1;
              } while (iVar44 < (int)local_354);
              iVar44 = (int)local_350;
            }
            do {
              binary::read_value<int>(stream,(int *)(local_2c0._M_local_buf + 4),bVar47);
              local_2c0._M_allocated_capacity._0_4_ = local_2c0._M_allocated_capacity._4_4_ + -1;
              iVar7._M_current =
                   *(int **)((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish + lVar43);
              if (iVar7._M_current ==
                  *(int **)((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar43)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar43),iVar7,
                           (int *)local_2c0._M_local_buf);
              }
              else {
                *iVar7._M_current = local_2c0._M_allocated_capacity._0_4_;
                *(int **)((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + lVar43) = iVar7._M_current + 1;
              }
              iVar44 = iVar44 + -1;
            } while (iVar44 != 0);
            iVar19 = iVar19 + 1;
            iVar18 = iVar18 + 1;
          } while (iVar19 < (int)(uint)local_330.write_.shared_alloc_.alloc);
        }
      } while (iVar18 < (int)(uint)local_318.write_.shared_alloc_.alloc);
    }
  }
  else {
    if ((uint)local_318.write_.shared_alloc_.alloc == 0) goto LAB_002d2df5;
    local_350 = (ClassSets *)((ulong)local_350 & 0xffffffff00000000);
    local_344 = OMEGA_H_SIMPLEX;
    do {
      std::istream::operator>>((istream *)stream,(int *)local_2e8);
      if ((int)local_2e8._0_4_ < 1) {
        fail("assertion %s failed at %s +%d\n","number > 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x1b4);
      }
      std::istream::operator>>((istream *)stream,(int *)&local_330);
      uVar20 = type_dim((uint)local_330.write_.shared_alloc_.alloc);
      if ((0xf < (uint)local_330.write_.shared_alloc_.alloc) ||
         (((0x8016U >> ((uint)local_330.write_.shared_alloc_.alloc & 0x1f) & 1) == 0 &&
          (local_344 = OMEGA_H_HYPERCUBE,
          (0x28U >> ((uint)local_330.write_.shared_alloc_.alloc & 0x1f) & 1) == 0)))) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x40);
      }
      std::istream::operator>>((istream *)stream,(int *)&local_354);
      if ((int)local_354 < 2) {
        fail("assertion %s failed at %s +%d\n","ntags >= 2",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x1bb);
      }
      piVar22 = (istream *)std::istream::operator>>((istream *)stream,(int *)&local_348);
      std::istream::operator>>(piVar22,&local_33c);
      uVar26 = (ulong)uVar20;
      iVar7._M_current = (int *)(&local_118._M_string_length)[uVar26 * 3];
      if (iVar7._M_current == *(int **)((long)&local_118.field_2 + uVar26 * 0x18)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)(&local_118._M_dataplus + uVar26 * 3),iVar7,
                   &local_33c);
      }
      else {
        *iVar7._M_current = local_33c;
        (&local_118._M_string_length)[uVar26 * 3] = (size_type)(iVar7._M_current + 1);
      }
      if (local_348 != 0) {
        std::
        _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<int&,int&>
                  ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)(local_2b0 + uVar26 * 0x38),&local_33c,&local_348);
      }
      if (2 < (int)local_354) {
        iVar18 = 2;
        do {
          std::istream::operator>>((istream *)stream,&local_31c);
          iVar18 = iVar18 + 1;
        } while (iVar18 < (int)local_354);
      }
      iVar18 = uVar20 + 1;
      do {
        std::istream::operator>>((istream *)stream,(int *)(local_2c0._M_local_buf + 4));
        local_2c0._M_allocated_capacity._0_4_ = local_2c0._M_allocated_capacity._4_4_ + -1;
        iVar7._M_current =
             (&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_1b8 + uVar26,iVar7,(int *)local_2c0._M_local_buf);
        }
        else {
          *iVar7._M_current = local_2c0._M_allocated_capacity._0_4_;
          (&local_1b8)[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      iVar18 = (int)local_350 + 1;
      local_350 = (ClassSets *)CONCAT44(local_350._4_4_,iVar18);
    } while (iVar18 < (int)(uint)local_318.write_.shared_alloc_.alloc);
  }
  local_330.write_.shared_alloc_.alloc._0_4_ = 0;
  local_350 = (ClassSets *)(local_2c0._8_8_ + 0x3a8);
  do {
    for (puVar30 = *(undefined8 **)
                    (local_2b0 + (long)(int)(uint)local_330.write_.shared_alloc_.alloc * 0x38 + 0x10
                    ); puVar30 != (undefined8 *)0x0; puVar30 = (undefined8 *)*puVar30) {
      local_354 = *(uint *)(puVar30 + 1);
      uVar20 = *(uint *)((long)puVar30 + 0xc);
      uVar41 = -uVar20;
      if (0 < (int)uVar20) {
        uVar41 = uVar20;
      }
      __len = 1;
      if (9 < uVar41) {
        uVar26 = (ulong)uVar41;
        uVar15 = 4;
        do {
          __len = uVar15;
          uVar21 = (uint)uVar26;
          if (uVar21 < 100) {
            __len = __len - 2;
            goto LAB_002d2e9c;
          }
          if (uVar21 < 1000) {
            __len = __len - 1;
            goto LAB_002d2e9c;
          }
          if (uVar21 < 10000) goto LAB_002d2e9c;
          uVar26 = uVar26 / 10000;
          uVar15 = __len + 4;
        } while (99999 < uVar21);
        __len = __len + 1;
      }
LAB_002d2e9c:
      local_2e8._0_8_ = local_2e8 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_2e8,(char)__len - (char)((int)uVar20 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_2e8._0_8_ + (ulong)(uVar20 >> 0x1f)),__len,uVar41);
      if ((int)uVar20 <=
          (int)((ulong)((long)local_138.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
        std::__cxx11::string::_M_assign((string *)local_2e8);
      }
      pvVar23 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                ::operator[](local_350,(key_type *)local_2e8);
      std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
      emplace_back<int&,int_const&>(pvVar23,(int *)&local_330,(int *)&local_354);
      if ((Alloc *)local_2e8._0_8_ != (Alloc *)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
    }
    uVar20 = (uint)local_330.write_.shared_alloc_.alloc + 1;
    p_Var25 = (_Base_ptr)(ulong)uVar20;
    bVar47 = (int)(uint)local_330.write_.shared_alloc_.alloc < 3;
    local_330.write_.shared_alloc_.alloc._0_4_ = uVar20;
  } while (bVar47);
  lVar43 = 0xa8;
  do {
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_2b0 + lVar43));
    lVar43 = lVar43 + -0x38;
  } while (lVar43 != -0x38);
LAB_002d2fa9:
  iVar18 = local_340;
  uVar26 = 3;
  if (((local_168 == lStack_170) && (uVar26 = 2, lStack_180 == local_188)) &&
     (uVar26 = 1, local_198 == lStack_1a0)) {
    fail("There were no Elements of dimension higher than zero!\n");
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  iVar19 = (int)uVar26;
  HostWrite<double>::HostWrite((HostWrite<double> *)local_2e8,iVar18 * iVar19,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  uVar32 = uVar26;
  if (0 < (long)local_340) {
    lVar43 = 0;
    p_Var25 = (_Base_ptr)
              local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar39 = 0;
      do {
        *(double *)(local_2e8._8_8_ + uVar39 * 8) =
             (((pointer)p_Var25)->super_Few<double,_3>).array_[uVar39];
        uVar39 = uVar39 + 1;
      } while (uVar26 != uVar39);
      lVar43 = lVar43 + 1;
      local_2e8._8_8_ = local_2e8._8_8_ + (ulong)(uint)(iVar19 * 8);
      p_Var25 = (_Base_ptr)((long)p_Var25 + 0x18);
    } while (lVar43 != local_340);
  }
  do {
    if (local_344 == OMEGA_H_SIMPLEX) {
      bVar47 = true;
      puVar27 = &switchD_002d30ea::switchdataD_00448c40;
      switch(uVar32 & 0xffffffff) {
      case 0:
        uVar20 = 1;
        break;
      case 1:
        uVar20 = 2;
        break;
      case 2:
        uVar20 = 3;
        break;
      case 3:
        uVar20 = 4;
        break;
      default:
        goto switchD_002d30c9_default;
      }
    }
    else {
      puVar27 = &switchD_002d30c9::switchdataD_00448c30;
      switch(uVar32 & 0xffffffff) {
      case 0:
        uVar20 = 1;
        break;
      case 1:
        uVar20 = 2;
        break;
      case 2:
        uVar20 = 4;
        break;
      case 3:
        uVar20 = 8;
        break;
      default:
switchD_002d30c9_default:
        uVar20 = 0xffffffff;
        bVar47 = false;
        puVar27 = &p_Var25->_M_color;
        goto LAB_002d3113;
      }
      bVar47 = true;
    }
LAB_002d3113:
    uVar39 = (ulong)((long)(&local_1b8)[uVar32].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(&local_1b8)[uVar32].super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start) >> 2;
    uVar39 = (long)((ulong)(uint)((int)uVar39 >> 0x1f) << 0x20 | uVar39 & 0xffffffff) /
             (long)(int)uVar20;
    local_2b0._0_8_ = local_2b0 + 0x10;
    local_350 = (ClassSets *)uVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
    size_in = (LO)uVar39;
    HostWrite<int>::HostWrite(&local_318,size_in * uVar20,(string *)local_2b0);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) + 1);
    }
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
    HostWrite<int>::HostWrite(&local_330,size_in,(string *)local_2b0);
    __buf = extraout_RDX;
    if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) + 1);
      __buf = extraout_RDX_00;
    }
    if (0 < size_in) {
      __buf = (&local_118._M_dataplus)[uVar32 * 3]._M_p;
      uVar38 = 1;
      if (1 < (int)uVar20) {
        uVar38 = (ulong)uVar20;
      }
      lVar43 = 0;
      uVar40 = 0;
      puVar27 = (uint *)local_318.write_.shared_alloc_.direct_ptr;
      do {
        if (bVar47) {
          piVar8 = (&local_1b8)[uVar32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar46 = 0;
          do {
            (&((_Rb_tree_node_base *)&((_Base_ptr)puVar27)->_M_color)->_M_color)[uVar46] =
                 *(_Rb_tree_color *)((long)piVar8 + uVar46 * 4 + lVar43);
            uVar46 = uVar46 + 1;
          } while (uVar38 != uVar46);
        }
        *(undefined4 *)((long)local_330.write_.shared_alloc_.direct_ptr + uVar40 * 4) =
             *(undefined4 *)(__buf + uVar40 * 4);
        uVar40 = uVar40 + 1;
        lVar43 = lVar43 + (long)(int)uVar20 * 4;
        puVar27 = &((_Rb_tree_node_base *)&((_Base_ptr)puVar27)->_M_color)->_M_color + (int)uVar20;
      } while (uVar40 != (uVar39 & 0xffffffff));
    }
    HostWrite<int>::write((HostWrite<int> *)&local_40,(int)&local_318,__buf,(size_t)puVar27);
    Read<int>::Read((Read<signed_char> *)local_2b0,&local_40);
    pAVar10 = local_40.shared_alloc_.alloc;
    uVar29 = (undefined7)((ulong)puVar27 >> 8);
    uVar24 = extraout_RDX_01;
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40.shared_alloc_.alloc);
        operator_delete(pAVar10,0x48);
        uVar24 = extraout_RDX_02;
      }
    }
    if (local_350 == (ClassSets *)uVar26) {
      local_148.write_.shared_alloc_.alloc = (Alloc *)local_2b0._0_8_;
      bVar47 = (Alloc *)local_2b0._0_8_ == (Alloc *)0x0;
      puVar28 = (undefined1 *)CONCAT71(uVar29,bVar47);
      bVar16 = (local_2b0._0_8_ & 7) != 0;
      if (!bVar16 && !bVar47) {
        puVar28 = &entering_parallel;
        if (entering_parallel == '\x01') {
          local_148.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_2b0._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_2b0._0_8_ + 0x30) = *(int *)(local_2b0._0_8_ + 0x30) + 1;
        }
      }
      local_148.write_.shared_alloc_.direct_ptr = (void *)local_2b0._8_8_;
      HostWrite<double>::write
                ((HostWrite<double> *)&local_60,(int)local_2e8,
                 (void *)CONCAT71((int7)((ulong)uVar24 >> 8),bVar16 || bVar47),(size_t)puVar28);
      Read<double>::Read(&local_50,&local_60);
      ev2v = &local_148;
      build_from_elems_and_coords((Mesh *)local_2c0._8_8_,local_344,iVar19,ev2v,(Reals *)&local_50);
      pAVar10 = local_50.write_.shared_alloc_.alloc;
      uVar29 = (undefined7)((ulong)ev2v >> 8);
      uVar24 = extraout_RDX_03;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
          uVar24 = extraout_RDX_04;
        }
      }
      pAVar10 = local_60.shared_alloc_.alloc;
      if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 &&
          local_60.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_60.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60.shared_alloc_.alloc);
          operator_delete(pAVar10,0x48);
          uVar24 = extraout_RDX_05;
        }
      }
      pAVar10 = local_148.write_.shared_alloc_.alloc;
      if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
          local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar10);
          operator_delete(pAVar10,0x48);
          uVar24 = extraout_RDX_06;
        }
      }
    }
    pCVar2 = local_350;
    local_158.write_.shared_alloc_.alloc = (Alloc *)local_2b0._0_8_;
    bVar47 = (Alloc *)local_2b0._0_8_ == (Alloc *)0x0;
    puVar28 = (undefined1 *)CONCAT71(uVar29,bVar47);
    bVar16 = (local_2b0._0_8_ & 7) != 0;
    this_00 = &local_70;
    if (!bVar16 && !bVar47) {
      puVar28 = &entering_parallel;
      if (entering_parallel == '\x01') {
        local_158.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_2b0._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_2b0._0_8_ + 0x30) = *(int *)(local_2b0._0_8_ + 0x30) + 1;
      }
    }
    local_158.write_.shared_alloc_.direct_ptr = (void *)local_2b0._8_8_;
    HostWrite<int>::write
              ((HostWrite<int> *)&local_80,(int)&local_330,
               (void *)CONCAT71((int7)((ulong)uVar24 >> 8),bVar16 || bVar47),(size_t)puVar28);
    Read<int>::Read(this_00,&local_80);
    classify_equal_order((Mesh *)local_2c0._8_8_,(Int)pCVar2,&local_158,(Read<int> *)this_00);
    pAVar10 = local_70.write_.shared_alloc_.alloc;
    uVar29 = (undefined7)((ulong)this_00 >> 8);
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
        operator_delete(pAVar10,0x48);
      }
    }
    pAVar10 = local_80.shared_alloc_.alloc;
    if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 &&
        local_80.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_80.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_80.shared_alloc_.alloc);
        operator_delete(pAVar10,0x48);
      }
    }
    pAVar10 = local_158.write_.shared_alloc_.alloc;
    if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
        local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar10);
        operator_delete(pAVar10,0x48);
      }
    }
    uVar24 = local_2b0._0_8_;
    if ((local_2b0._0_8_ & 7) == 0 && (Alloc *)local_2b0._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_2b0._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_2b0._0_8_);
        operator_delete((void *)uVar24,0x48);
      }
    }
    pAVar10 = (Alloc *)CONCAT44(local_330.write_.shared_alloc_.alloc._4_4_,
                                (uint)local_330.write_.shared_alloc_.alloc);
    if (((uint)local_330.write_.shared_alloc_.alloc & 7) == 0 && pAVar10 != (Alloc *)0x0) {
      piVar1 = &pAVar10->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar10);
        operator_delete(pAVar10,0x48);
      }
    }
    pAVar10 = (Alloc *)CONCAT44(local_318.write_.shared_alloc_.alloc._4_4_,
                                (uint)local_318.write_.shared_alloc_.alloc);
    bVar47 = ((uint)local_318.write_.shared_alloc_.alloc & 7) != 0;
    p_Var25 = (_Base_ptr)CONCAT71(uVar29,bVar47 || pAVar10 == (Alloc *)0x0);
    if (!bVar47 && pAVar10 != (Alloc *)0x0) {
      piVar1 = &pAVar10->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar10);
        operator_delete(pAVar10,0x48);
      }
    }
    uVar32 = (long)pCVar2 - 1;
    if ((long)pCVar2 < 1) {
      finalize_classification((Mesh *)local_2c0._8_8_);
      uVar24 = local_2e8._0_8_;
      if ((local_2e8._0_8_ & 7) == 0 && (Alloc *)local_2e8._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_2e8._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_2e8._0_8_);
          operator_delete((void *)uVar24,0x48);
        }
      }
      lVar43 = 0x60;
      do {
        pvVar9 = *(void **)((long)&local_1d0 + lVar43);
        if (pvVar9 != (void *)0x0) {
          operator_delete(pvVar9,*(long *)((long)&uStack_1c0 + lVar43) - (long)pvVar9);
        }
        lVar43 = lVar43 + -0x18;
      } while (lVar43 != 0);
      lVar43 = 0x60;
      do {
        pvVar9 = *(void **)((long)&local_138.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + lVar43);
        if (pvVar9 != (void *)0x0) {
          operator_delete(pvVar9,*(long *)((long)&lStack_120 + lVar43) - (long)pvVar9);
        }
        lVar43 = lVar43 + -0x18;
      } while (lVar43 != 0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_b8);
      if (local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_308.
                        super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_308.
                              super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.
                              super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      return;
    }
  } while( true );
}

Assistant:

void read_internal(std::istream& stream, Mesh* mesh) {
  seek_line(stream, "$MeshFormat");
  Real format;
  Int file_type;
  Int data_size;
  stream >> format >> file_type >> data_size;
  OMEGA_H_CHECK(file_type == 0 || file_type == 1);
  bool is_binary = (file_type == 1);
  bool needs_swapping = false;
  if (is_binary) {
    eat_newlines(stream);
    int one;
    binary::read_value(stream, one, false);
    if (one != 1) {
      needs_swapping = true;
      binary::swap_bytes(one);
      OMEGA_H_CHECK(one == 1);
    }
  }
  OMEGA_H_CHECK(data_size == sizeof(Real));
  std::vector<std::string> physical_names;
  if (seek_optional_section(stream, "$PhysicalNames")) {
    Int num_physicals;
    read(stream, num_physicals, is_binary, needs_swapping);
    physical_names.reserve(static_cast<std::size_t>(num_physicals));
    eat_newlines(stream);
    for (auto i = 0; i < num_physicals; ++i) {
      Int dim, number;
      read(stream, dim, is_binary, needs_swapping);
      read(stream, number, is_binary, needs_swapping);
      OMEGA_H_CHECK(number == i + 1);
      std::string name;
      stream >> name;
      physical_names.push_back(name.substr(1, name.size() - 2));
    }
  }
  if (seek_optional_section(stream, "$Entities")) {
    read_internal_entities_section(
        *mesh, format, physical_names, stream, is_binary, needs_swapping);
    std::string line;
    std::getline(stream, line);
    // line matches "[ ]*"
    if (!line.empty()) {
      line.erase(std::remove_if(line.begin(), line.end(),
          [](unsigned char c) { return std::isspace(c); }));
    }
    OMEGA_H_CHECK(line.empty());
    std::getline(stream, line);
    OMEGA_H_CHECK(line == "$EndEntities");
  }
  seek_line(stream, "$Nodes");
  std::vector<Vector<3>> node_coords;
  std::map<int, int> node_number_map;
  int nnodes;
  if (format >= 4.0) {
    eat_newlines(stream);
    int num_entity_blocks;
    read(stream, num_entity_blocks, is_binary, needs_swapping);
    read(stream, nnodes, is_binary, needs_swapping);
    node_coords.reserve(std::size_t(nnodes));
    if (format >= 4.1) {
      int node_tag;
      read(stream, node_tag, is_binary, needs_swapping);  // min
      read(stream, node_tag, is_binary, needs_swapping);  // max
      for (int entity_block = 0; entity_block < num_entity_blocks;
           ++entity_block) {
        int class_id, class_dim;
        read(stream, class_dim, is_binary, needs_swapping);
        read(stream, class_id, is_binary, needs_swapping);
        int node_type, num_block_nodes;
        read(stream, node_type, is_binary, needs_swapping);
        read(stream, num_block_nodes, is_binary, needs_swapping);
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          const auto position = int(node_coords.size() + block_node);
          node_number_map[node_number] = position;
        }
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          Vector<3> coords;
          read(stream, coords[0], is_binary, needs_swapping);
          read(stream, coords[1], is_binary, needs_swapping);
          read(stream, coords[2], is_binary, needs_swapping);
          node_coords.push_back(coords);
        }
      }

    } else {
      for (int entity_block = 0; entity_block < num_entity_blocks;
           ++entity_block) {
        int class_id, class_dim;
        read(stream, class_id, is_binary, needs_swapping);
        read(stream, class_dim, is_binary, needs_swapping);
        int node_type, num_block_nodes;
        read(stream, node_type, is_binary, needs_swapping);
        read(stream, num_block_nodes, is_binary, needs_swapping);
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          node_number_map[node_number] = int(node_coords.size());
          Vector<3> coords;
          read(stream, coords[0], is_binary, needs_swapping);
          read(stream, coords[1], is_binary, needs_swapping);
          read(stream, coords[2], is_binary, needs_swapping);
          node_coords.push_back(coords);
        }
      }
    }
  } else {
    stream >> nnodes;
    OMEGA_H_CHECK(nnodes >= 0);
    node_coords.reserve(std::size_t(nnodes));
    eat_newlines(stream);
    for (LO i = 0; i < nnodes; ++i) {
      LO number;
      read(stream, number, is_binary, needs_swapping);
      // the documentation says numbers don't have to be linear,
      // but so far they have been and assuming they are saves
      // me a big lookup structure (e.g. std::map)
      OMEGA_H_CHECK(number == i + 1);
      Vector<3> coords;
      read(stream, coords[0], is_binary, needs_swapping);
      read(stream, coords[1], is_binary, needs_swapping);
      read(stream, coords[2], is_binary, needs_swapping);
      node_coords.push_back(coords);
    }
  }
  seek_line(stream, "$Elements");
  std::array<std::vector<int>, 4> ent_class_ids;
  std::array<std::vector<int>, 4> ent_nodes;
  Omega_h_Family family = OMEGA_H_SIMPLEX;
  if (format >= 4.0) {
    eat_newlines(stream);
    int num_entity_blocks, total_num_ents;
    read(stream, num_entity_blocks, is_binary, needs_swapping);
    read(stream, total_num_ents, is_binary, needs_swapping);
    if (format >= 4.1) {
      int element_tag;
      read(stream, element_tag, is_binary, needs_swapping);  // min
      read(stream, element_tag, is_binary, needs_swapping);  // max
    }
    for (int entity_block = 0; entity_block < num_entity_blocks;
         ++entity_block) {
      int class_id, class_dim;
      if (format == 4.) {
        read(stream, class_id, is_binary, needs_swapping);
        read(stream, class_dim, is_binary, needs_swapping);
      } else {
        read(stream, class_dim, is_binary, needs_swapping);
        read(stream, class_id, is_binary, needs_swapping);
      }
      int ent_type, num_block_ents;
      read(stream, ent_type, is_binary, needs_swapping);
      read(stream, num_block_ents, is_binary, needs_swapping);
      Int dim = type_dim(ent_type);
      OMEGA_H_CHECK(dim == class_dim);
      if (type_family(ent_type) == OMEGA_H_HYPERCUBE) {
        family = OMEGA_H_HYPERCUBE;
      }
      int nodes_per_ent = element_degree(family, dim, 0);
      ent_class_ids[dim].reserve(
          ent_class_ids[dim].size() + std::size_t(num_block_ents));
      ent_nodes[dim].reserve(
          ent_nodes[dim].size() + std::size_t(num_block_ents * nodes_per_ent));
      for (int block_ent = 0; block_ent < num_block_ents; ++block_ent) {
        ent_class_ids[dim].push_back(class_id);
        int ent_number;
        read(stream, ent_number, is_binary, needs_swapping);
        for (int ent_node = 0; ent_node < nodes_per_ent; ++ent_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          auto it = node_number_map.find(node_number);
          OMEGA_H_CHECK(it != node_number_map.end());
          ent_nodes[dim].push_back(it->second);
        }
      }
    }

  } else {
    LO nents;
    stream >> nents;
    OMEGA_H_CHECK(nents >= 0);
    std::array<std::unordered_map<Int, Int>, 4> ent2physical;
    if (is_binary) {
      eat_newlines(stream);
      LO i = 0;
      while (i < nents) {
        I32 type, nfollow, ntags;
        binary::read_value(stream, type, needs_swapping);
        binary::read_value(stream, nfollow, needs_swapping);
        binary::read_value(stream, ntags, needs_swapping);
        Int dim = type_dim(type);
        if (type_family(type) == OMEGA_H_HYPERCUBE) {
          family = OMEGA_H_HYPERCUBE;
        }
        Int neev = element_degree(family, dim, 0);
        OMEGA_H_CHECK(ntags >= 2);
        for (Int j = 0; j < nfollow; ++j, ++i) {
          I32 number, physical, elementary;
          binary::read_value(stream, number, needs_swapping);
          binary::read_value(stream, physical, needs_swapping);
          binary::read_value(stream, elementary, needs_swapping);
          ent_class_ids[dim].push_back(elementary);
          if (physical != 0) {
            ent2physical[dim].emplace(elementary, physical);
          }
          for (Int k = 2; k < ntags; ++k) {
            I32 ignored;
            binary::read_value(stream, ignored, false);
          }
          for (Int k = 0; k < neev; ++k) {
            I32 node_number;
            binary::read_value(stream, node_number, needs_swapping);
            ent_nodes[dim].push_back(node_number - 1);
          }
        }
      }
    } else {
      for (LO i = 0; i < nents; ++i) {
        LO number;
        stream >> number;
        OMEGA_H_CHECK(number > 0);
        Int type;
        stream >> type;
        Int dim = type_dim(type);
        if (type_family(type) == OMEGA_H_HYPERCUBE) family = OMEGA_H_HYPERCUBE;
        Int ntags;
        stream >> ntags;
        OMEGA_H_CHECK(ntags >= 2);
        Int physical, elementary;
        stream >> physical >> elementary;
        ent_class_ids[dim].push_back(elementary);
        if (physical != 0) {
          ent2physical[dim].emplace(elementary, physical);
        }
        Int tag;
        for (Int j = 2; j < ntags; ++j) {
          stream >> tag;
        }
        Int neev = dim + 1;
        LO node_number;
        for (Int j = 0; j < neev; ++j) {
          stream >> node_number;
          ent_nodes[dim].push_back(node_number - 1);
        }
      }
    }
    for (Int dim = 0; dim < static_cast<Int>(ent2physical.size()); ++dim) {
      const auto& entities = ent2physical[dim];
      for (const auto& pair : entities) {
        const auto entity = pair.first;
        const auto physical = pair.second;
        std::string physical_name(std::to_string(physical));
        if (physical <= static_cast<Int>(physical_names.size())) {
          physical_name = physical_names[physical - 1];
        }
        mesh->class_sets[physical_name].emplace_back(dim, entity);
      }
    }
  }
  Int max_dim;
  if (ent_nodes[3].size()) {
    max_dim = 3;
  } else if (ent_nodes[2].size()) {
    max_dim = 2;
  } else if (ent_nodes[1].size()) {
    max_dim = 1;
  } else {
    Omega_h_fail("There were no Elements of dimension higher than zero!\n");
  }
  HostWrite<Real> host_coords(nnodes * max_dim);
  for (LO i = 0; i < nnodes; ++i) {
    for (Int j = 0; j < max_dim; ++j) {
      host_coords[i * max_dim + j] =
          node_coords[static_cast<std::size_t>(i)][j];
    }
  }
  for (Int ent_dim = max_dim; ent_dim >= 0; --ent_dim) {
    Int neev = element_degree(family, ent_dim, VERT);
    LO ndim_ents = static_cast<LO>(ent_nodes[ent_dim].size()) / neev;
    HostWrite<LO> host_ev2v(ndim_ents * neev);
    HostWrite<LO> host_class_id(ndim_ents);
    for (LO i = 0; i < ndim_ents; ++i) {
      for (Int j = 0; j < neev; ++j) {
        host_ev2v[i * neev + j] =
            ent_nodes[ent_dim][static_cast<std::size_t>(i * neev + j)];
      }
      host_class_id[i] = ent_class_ids[ent_dim][static_cast<std::size_t>(i)];
    }
    auto eqv2v = Read<LO>(host_ev2v.write());
    if (ent_dim == max_dim) {
      build_from_elems_and_coords(
          mesh, family, max_dim, eqv2v, host_coords.write());
    }
    classify_equal_order(mesh, ent_dim, eqv2v, host_class_id.write());
  }
  finalize_classification(mesh);
}